

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::IEEEFloat::initFromFloatAPInt(IEEEFloat *this,APInt *api)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  Significand SVar4;
  Significand SVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  
  if (api->BitWidth != 0x20) {
    __assert_fail("api.getBitWidth()==32",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc60,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  uVar3 = (api->U).VAL;
  uVar7 = uVar3 >> 0x17 & 0xff;
  this->semantics = (fltSemantics *)semIEEEsingle;
  bVar2 = this->field_0x12;
  bVar8 = (byte)(uVar3 >> 0x1c) & 8;
  this->field_0x12 = bVar2 & 0xf7 | bVar8;
  iVar6 = (int)uVar7;
  if (iVar6 == 0 && (uVar3 & 0x7fffff) == 0) {
    bVar8 = bVar2 & 0xf0 | bVar8 | 3;
  }
  else {
    if (iVar6 != 0xff || (uVar3 & 0x7fffff) != 0) {
      bVar8 = bVar2 & 0xf0 | bVar8;
      if ((uVar3 & 0x7fffff) != 0 && iVar6 == 0xff) {
        this->field_0x12 = bVar8 | 1;
        SVar4._0_4_ = (uint)uVar3 & 0x7fffff;
        SVar4.part._4_4_ = 0;
        this->significand = SVar4;
        return;
      }
      SVar5._0_4_ = (uint)uVar3 & 0x7fffff;
      SVar5.part._4_4_ = 0;
      this->field_0x12 = bVar8 | 2;
      this->exponent = (short)uVar7 + -0x7f;
      this->significand = SVar5;
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&this->significand + 2);
        *pbVar1 = *pbVar1 | 0x80;
        return;
      }
      this->exponent = -0x7e;
      return;
    }
    bVar8 = bVar2 & 0xf0 | bVar8;
  }
  this->field_0x12 = bVar8;
  return;
}

Assistant:

void IEEEFloat::initFromFloatAPInt(const APInt &api) {
  assert(api.getBitWidth()==32);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 23) & 0xff;
  uint32_t mysignificand = i & 0x7fffff;

  initialize(&semIEEEsingle);
  assert(partCount()==1);

  sign = i >> 31;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0xff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0xff && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 127;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -126;
    else
      *significandParts() |= 0x800000; // integer bit
  }
}